

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::DrawIndirect(DeviceContextVkImpl *this,DrawIndirectAttribs *Attribs)

{
  Uint64 UVar1;
  BufferVkImpl *this_00;
  VkBuffer pVVar2;
  size_t sVar3;
  VkBuffer CountBuffer;
  size_t sVar4;
  uint32_t local_5c;
  BufferVkImpl *local_38;
  BufferVkImpl *pCountBufferVk;
  BufferVkImpl *pIndirectDrawAttribsVk;
  DrawIndirectAttribs *Attribs_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::DrawIndirect
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  this_00 = PrepareIndirectAttribsBuffer
                      (this,Attribs->pAttribsBuffer,Attribs->AttribsBufferStateTransitionMode,
                       "Indirect draw (DeviceContextVkImpl::DrawIndirect)");
  if (Attribs->pCounterBuffer == (IBuffer *)0x0) {
    local_38 = (BufferVkImpl *)0x0;
  }
  else {
    local_38 = PrepareIndirectAttribsBuffer
                         (this,Attribs->pCounterBuffer,Attribs->CounterBufferStateTransitionMode,
                          "Count buffer (DeviceContextVkImpl::DrawIndirect)");
  }
  PrepareForDraw(this,Attribs->Flags);
  if (Attribs->DrawCount != 0) {
    if (Attribs->pCounterBuffer == (IBuffer *)0x0) {
      pVVar2 = BufferVkImpl::GetVkBuffer(this_00);
      sVar3 = GetDynamicBufferOffset(this,this_00,true);
      if (Attribs->DrawCount < 2) {
        local_5c = 0;
      }
      else {
        local_5c = Attribs->DrawArgsStride;
      }
      VulkanUtilities::VulkanCommandBuffer::DrawIndirect
                (&this->m_CommandBuffer,pVVar2,sVar3 + Attribs->DrawArgsOffset,Attribs->DrawCount,
                 local_5c);
    }
    else {
      pVVar2 = BufferVkImpl::GetVkBuffer(this_00);
      sVar3 = GetDynamicBufferOffset(this,this_00,true);
      UVar1 = Attribs->DrawArgsOffset;
      CountBuffer = BufferVkImpl::GetVkBuffer(local_38);
      sVar4 = GetDynamicBufferOffset(this,local_38,true);
      VulkanUtilities::VulkanCommandBuffer::DrawIndirectCount
                (&this->m_CommandBuffer,pVVar2,sVar3 + UVar1,CountBuffer,
                 sVar4 + Attribs->CounterOffset,Attribs->DrawCount,Attribs->DrawArgsStride);
    }
  }
  (this->m_State).NumCommands = (this->m_State).NumCommands + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::DrawIndirect(const DrawIndirectAttribs& Attribs)
{
    TDeviceContextBase::DrawIndirect(Attribs, 0);

    // We must prepare indirect draw attribs buffer first because state transitions must
    // be performed outside of render pass, and PrepareForDraw commits render pass
    BufferVkImpl* pIndirectDrawAttribsVk = PrepareIndirectAttribsBuffer(Attribs.pAttribsBuffer, Attribs.AttribsBufferStateTransitionMode, "Indirect draw (DeviceContextVkImpl::DrawIndirect)");
    BufferVkImpl* pCountBufferVk         = Attribs.pCounterBuffer != nullptr ?
        PrepareIndirectAttribsBuffer(Attribs.pCounterBuffer, Attribs.CounterBufferStateTransitionMode, "Count buffer (DeviceContextVkImpl::DrawIndirect)") :
        nullptr;

    PrepareForDraw(Attribs.Flags);

    if (Attribs.DrawCount > 0)
    {
        if (Attribs.pCounterBuffer == nullptr)
        {
            m_CommandBuffer.DrawIndirect(pIndirectDrawAttribsVk->GetVkBuffer(),
                                         GetDynamicBufferOffset(pIndirectDrawAttribsVk) + Attribs.DrawArgsOffset,
                                         Attribs.DrawCount, Attribs.DrawCount > 1 ? Attribs.DrawArgsStride : 0);
        }
        else
        {
            m_CommandBuffer.DrawIndirectCount(pIndirectDrawAttribsVk->GetVkBuffer(),
                                              GetDynamicBufferOffset(pIndirectDrawAttribsVk) + Attribs.DrawArgsOffset,
                                              pCountBufferVk->GetVkBuffer(),
                                              GetDynamicBufferOffset(pCountBufferVk) + Attribs.CounterOffset,
                                              Attribs.DrawCount,
                                              Attribs.DrawArgsStride);
        }
    }

    ++m_State.NumCommands;
}